

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O3

bool tcu::isLinearMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,Vec4 *result)

{
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  undefined1 auVar1 [16];
  int c;
  bool bVar2;
  TextureChannelClass TVar3;
  int iVar4;
  int c_00;
  int iVar5;
  int iVar6;
  int iVar7;
  int y1;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar8;
  uint uVar9;
  int iVar10;
  uint y0;
  undefined4 extraout_var;
  int c_01;
  Vec2 *yBounds0;
  Vec2 *xBounds1;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 uVar20;
  float local_18c;
  float local_184;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  ColorQuad quad0;
  ColorQuad quad1;
  
  dim = (level0->m_size).m_data[0];
  dim_00 = (level0->m_size).m_data[1];
  dim_01 = (level1->m_size).m_data[0];
  dim_02 = (level1->m_size).m_data[1];
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds0,sampler->normalizedCoords,dim,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,sampler->normalizedCoords,dim_01,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds0,sampler->normalizedCoords,dim_00,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds1,sampler->normalizedCoords,dim_02,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar11 = floorf(uBounds0.m_data[0] + -0.5);
  fVar12 = floorf(uBounds0.m_data[1] + -0.5);
  fVar13 = floorf(uBounds1.m_data[0] + -0.5);
  fVar14 = floorf(uBounds1.m_data[1] + -0.5);
  fVar15 = floorf(vBounds0.m_data[0] + -0.5);
  fVar16 = floorf(vBounds0.m_data[1] + -0.5);
  fVar17 = floorf(vBounds1.m_data[0] + -0.5);
  fVar18 = floorf(vBounds1.m_data[1] + -0.5);
  TVar3 = getTextureChannelClass((level0->m_format).type);
  if (TVar3 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    local_184 = computeBilinearSearchStepForSnorm(prec);
  }
  else {
    local_184 = 0.0;
    if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_184 = computeBilinearSearchStepForUnorm(prec);
    }
  }
  if ((int)fVar15 <= (int)fVar16) {
    iVar4 = (int)fVar17;
    c = (int)fVar15;
    do {
      c_00 = c + 1;
      if ((int)fVar11 <= (int)fVar12) {
        iVar10 = (int)fVar11;
        do {
          quad0.p11.m_data[0] = 0.0;
          quad0.p11.m_data[1] = 0.0;
          quad0.p11.m_data[2] = 0.0;
          quad0.p11.m_data[3] = 0.0;
          quad0.p10.m_data[0] = 0.0;
          quad0.p10.m_data[1] = 0.0;
          quad0.p10.m_data[2] = 0.0;
          quad0.p10.m_data[3] = 0.0;
          quad0.p01.m_data[0] = 0.0;
          quad0.p01.m_data[1] = 0.0;
          quad0.p01.m_data[2] = 0.0;
          quad0.p01.m_data[3] = 0.0;
          quad0.p00.m_data[0] = 0.0;
          quad0.p00.m_data[1] = 0.0;
          quad0.p00.m_data[2] = 0.0;
          quad0.p00.m_data[3] = 0.0;
          iVar5 = TexVerifierUtil::wrap(sampler->wrapS,iVar10,dim);
          c_01 = iVar10 + 1;
          iVar6 = TexVerifierUtil::wrap(sampler->wrapS,c_01,dim);
          iVar7 = TexVerifierUtil::wrap(sampler->wrapT,c,dim_00);
          y1 = TexVerifierUtil::wrap(sampler->wrapT,c_00,dim_00);
          lookupQuad(&quad0,level0,sampler,iVar5,iVar6,iVar7,y1,coordZ);
          uVar8 = extraout_EAX;
          fVar15 = local_184;
          if (TVar3 == TEXTURECHANNELCLASS_FLOATING_POINT) {
            fVar15 = computeBilinearSearchStepFromFloatQuad(prec,&quad0);
            uVar8 = extraout_EAX_00;
          }
          fVar17 = (uBounds0.m_data[0] + -0.5) - (float)iVar10;
          auVar19._4_4_ = -(uint)((vBounds0.m_data[1] + -0.5) - (float)c < 0.0);
          auVar19._0_4_ = -(uint)((vBounds0.m_data[0] + -0.5) - (float)c < 0.0);
          auVar19._8_4_ = -(uint)(fVar17 < 0.0);
          auVar19._12_4_ = -(uint)((uBounds0.m_data[1] + -0.5) - (float)iVar10 < 0.0);
          uVar9 = movmskps(uVar8,auVar19);
          local_18c = 0.0;
          iVar10 = iVar4;
          if (((uVar9 & 4) == 0) && (local_18c = 1.0, fVar17 <= 1.0)) {
            local_18c = fVar17;
          }
          while (iVar5 = iVar10, iVar5 <= (int)fVar18) {
            iVar6 = (int)fVar13;
            while (iVar10 = iVar5 + 1, iVar6 <= (int)fVar14) {
              quad1.p11.m_data[0] = 0.0;
              quad1.p11.m_data[1] = 0.0;
              quad1.p11.m_data[2] = 0.0;
              quad1.p11.m_data[3] = 0.0;
              quad1.p10.m_data[0] = 0.0;
              quad1.p10.m_data[1] = 0.0;
              quad1.p10.m_data[2] = 0.0;
              quad1.p10.m_data[3] = 0.0;
              quad1.p01.m_data[0] = 0.0;
              quad1.p01.m_data[1] = 0.0;
              quad1.p01.m_data[2] = 0.0;
              quad1.p01.m_data[3] = 0.0;
              quad1.p00.m_data[0] = 0.0;
              quad1.p00.m_data[1] = 0.0;
              quad1.p00.m_data[2] = 0.0;
              quad1.p00.m_data[3] = 0.0;
              iVar10 = TexVerifierUtil::wrap(sampler->wrapS,iVar6,dim_01);
              uVar9 = TexVerifierUtil::wrap(sampler->wrapS,iVar6 + 1,dim_01);
              y0 = TexVerifierUtil::wrap(sampler->wrapT,iVar5,dim_02);
              iVar7 = TexVerifierUtil::wrap(sampler->wrapT,iVar5 + 1,dim_02);
              yBounds0 = (Vec2 *)(ulong)uVar9;
              xBounds1 = (Vec2 *)(ulong)y0;
              uVar20 = 0;
              uVar8 = extraout_var;
              lookupQuad(&quad1,level1,sampler,iVar10,uVar9,y0,iVar7,coordZ);
              fVar17 = local_184;
              if (TVar3 == TEXTURECHANNELCLASS_FLOATING_POINT) {
                fVar17 = computeBilinearSearchStepFromFloatQuad(prec,&quad1);
              }
              auVar1._4_4_ = -(uint)((vBounds1.m_data[1] + -0.5) - (float)iVar5 < 0.0);
              auVar1._0_4_ = -(uint)((vBounds1.m_data[0] + -0.5) - (float)iVar5 < 0.0);
              auVar1._8_4_ = -(uint)((uBounds1.m_data[0] + -0.5) - (float)iVar6 < 0.0);
              auVar1._12_4_ = -(uint)((uBounds1.m_data[1] + -0.5) - (float)iVar6 < 0.0);
              movmskps(iVar6,auVar1);
              bVar2 = is2DTrilinearFilterResultValid
                                (prec,&quad0,&quad1,(Vec2 *)result,yBounds0,xBounds1,
                                 (Vec2 *)CONCAT44(in_stack_fffffffffffffe4c,fBounds->m_data[0]),
                                 (Vec2 *)CONCAT44(uVar20,fBounds->m_data[1]),local_18c,
                                 (Vec4 *)CONCAT44(uVar8,~-(uint)(fVar15 <= fVar17) & (uint)fVar17 |
                                                        -(uint)(fVar15 <= fVar17) & (uint)fVar15));
              iVar6 = iVar6 + 1;
              if (bVar2) {
                return true;
              }
            }
          }
          iVar10 = c_01;
        } while (c_01 <= (int)fVar12);
      }
      c = c_00;
    } while (c_00 <= (int)fVar16);
  }
  return false;
}

Assistant:

static bool isLinearMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
												   const ConstPixelBufferAccess&	level1,
												   const Sampler&					sampler,
												   const LookupPrecision&			prec,
												   const Vec2&						coord,
												   const int						coordZ,
												   const Vec2&						fBounds,
												   const Vec4&						result)
{
	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int					w0				= level0.getWidth();
	const int					w1				= level1.getWidth();
	const int					h0				= level0.getHeight();
	const int					h1				= level1.getHeight();

	const Vec2					uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2					vBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int					minI0			= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int					maxI0			= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int					minI1			= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int					maxI1			= deFloorFloatToInt32(uBounds1.y()-0.5f);
	const int					minJ0			= deFloorFloatToInt32(vBounds0.x()-0.5f);
	const int					maxJ0			= deFloorFloatToInt32(vBounds0.y()-0.5f);
	const int					minJ1			= deFloorFloatToInt32(vBounds1.x()-0.5f);
	const int					maxJ1			= deFloorFloatToInt32(vBounds1.y()-0.5f);

	const TextureChannelClass	texClass		= getTextureChannelClass(level0.getFormat().type);
	const float					cSearchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			ColorQuad	quad0;
			float		searchStep0;

			{
				const int	x0		= wrap(sampler.wrapS, i0  , w0);
				const int	x1		= wrap(sampler.wrapS, i0+1, w0);
				const int	y0		= wrap(sampler.wrapT, j0  , h0);
				const int	y1		= wrap(sampler.wrapT, j0+1, h0);
				lookupQuad(quad0, level0, sampler, x0, x1, y0, y1, coordZ);

				if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
					searchStep0 = computeBilinearSearchStepFromFloatQuad(prec, quad0);
				else
					searchStep0 = cSearchStep;
			}

			const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);
			const float	minB0	= de::clamp((vBounds0.x()-0.5f)-float(j0), 0.0f, 1.0f);
			const float	maxB0	= de::clamp((vBounds0.y()-0.5f)-float(j0), 0.0f, 1.0f);

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					ColorQuad	quad1;
					float		searchStep1;

					{
						const int	x0		= wrap(sampler.wrapS, i1  , w1);
						const int	x1		= wrap(sampler.wrapS, i1+1, w1);
						const int	y0		= wrap(sampler.wrapT, j1  , h1);
						const int	y1		= wrap(sampler.wrapT, j1+1, h1);
						lookupQuad(quad1, level1, sampler, x0, x1, y0, y1, coordZ);

						if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
							searchStep1 = computeBilinearSearchStepFromFloatQuad(prec, quad1);
						else
							searchStep1 = cSearchStep;
					}

					const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);
					const float	minB1	= de::clamp((vBounds1.x()-0.5f)-float(j1), 0.0f, 1.0f);
					const float	maxB1	= de::clamp((vBounds1.y()-0.5f)-float(j1), 0.0f, 1.0f);

					if (is2DTrilinearFilterResultValid(prec, quad0, quad1, Vec2(minA0, maxA0), Vec2(minB0, maxB0), Vec2(minA1, maxA1), Vec2(minB1, maxB1),
													   fBounds, de::min(searchStep0, searchStep1), result))
						return true;
				}
			}
		}
	}

	return false;
}